

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O1

bool ImGui::ButtonColored(char *label,ImVec4 *color,ImVec2 *size)

{
  bool bVar1;
  ImVec4 colorPress;
  ImVec4 colorHover;
  ImVec4 local_40;
  ImVec4 local_30;
  
  local_40.w = color->w;
  local_30.x = (color->x + -1.0) * 0.8 + 1.0;
  local_30.y = (color->y + -1.0) * 0.8 + 1.0;
  local_30.z = (color->z + -1.0) * 0.8 + 1.0;
  local_40.w = (local_40.w - local_40.w) * 0.8 + local_40.w;
  local_40.x = color->x * 0.8 + 0.0;
  local_40.y = color->y * 0.8 + 0.0;
  local_40.z = color->z * 0.8 + 0.0;
  local_30.w = local_40.w;
  PushStyleColor(0x15,color);
  PushStyleColor(0x16,&local_30);
  PushStyleColor(0x17,&local_40);
  bVar1 = Button(label,size);
  PopStyleColor(3);
  return bVar1;
}

Assistant:

bool ButtonColored(const char *label, const ImVec4 &color, const ImVec2 &size) {
    ImVec4 colorHover = ImLerp({1, 1, 1, color.w}, color, 0.8f);
    ImVec4 colorPress = ImLerp({0, 0, 0, color.w}, color, 0.8f);
    ImGui::PushStyleColor(ImGuiCol_Button, color);
    ImGui::PushStyleColor(ImGuiCol_ButtonHovered, colorHover);
    ImGui::PushStyleColor(ImGuiCol_ButtonActive, colorPress);
    bool ret = ImGui::Button(label, size);
    ImGui::PopStyleColor(3);
    return ret;
}